

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O0

void absl::lts_20240722::flags_internal::FlagHelp
               (ostream *out,CommandLineFlag *flag,HelpFormat format)

{
  HelpFormat format_local;
  CommandLineFlag *flag_local;
  ostream *out_local;
  
  if (format == kHumanReadable) {
    anon_unknown_0::FlagHelpHumanReadable(flag,out);
  }
  return;
}

Assistant:

void FlagHelp(std::ostream& out, const CommandLineFlag& flag,
              HelpFormat format) {
  if (format == HelpFormat::kHumanReadable)
    flags_internal::FlagHelpHumanReadable(flag, out);
}